

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O0

void __thiscall Costs::fillCoeffsAG(Costs *this,double **coeffs,double *sumY,uint n)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  double *gtT_00;
  uint local_38;
  uint local_34;
  uint T;
  uint t;
  double *gtT;
  uint n_local;
  double *sumY_local;
  double **coeffs_local;
  Costs *this_local;
  
  auVar1 = ZEXT416(n + 1) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  gtT_00 = (double *)operator_new__(uVar3);
  for (local_34 = 1; local_34 < n - 1; local_34 = local_34 + 1) {
    gtT_00[local_34 + 1] = 0.0;
    uVar2 = local_34;
    while (local_38 = uVar2 + 1, local_38 < n) {
      gtT_00[uVar2 + 2] =
           ((double)(local_38 - local_34) * gtT_00[local_38] + (sumY[local_38] - sumY[local_34])) /
           (double)((local_38 - local_34) + 1);
      uVar2 = local_38;
    }
    linReg(this,coeffs[local_34],gtT_00,local_34,n);
  }
  *coeffs[n - 1] = 0.0;
  coeffs[n - 1][1] = 0.0;
  coeffs[n - 1][2] = 0.0;
  coeffs[n - 1][3] = 0.0;
  *coeffs[n] = 0.0;
  coeffs[n][1] = 0.0;
  coeffs[n][2] = 0.0;
  coeffs[n][3] = 0.0;
  if (gtT_00 != (double *)0x0) {
    operator_delete__(gtT_00);
  }
  return;
}

Assistant:

void Costs::fillCoeffsAG(double** coeffs, double* sumY, unsigned int n)
{
  ///fill coeffs[t] = CoeffsAG[t] for t = 1 to n-1 (0 and n un-necessary)
  double* gtT = new double[n + 1];
  for(unsigned int t = 1; t < (n - 1); t++) /// Fill coeffs[t] using gtT[t + 1]... gtT[n]
  {
    gtT[t + 1] = 0;
    for(unsigned int T = t + 1; T < n; T++) //update gtT from gtT[t + 2] to gtT[n-1]
    {
      gtT[T + 1] = ((T-t)*gtT[T] + (sumY[T]-sumY[t]))/(T-t+1);
    }
    linReg(coeffs[t], gtT, t, n); //consider gtT only from t + 1 to n in this function
    //std::cout << t << " : " << coeffs[t][0] << " "<< coeffs[t][1] << " "<< coeffs[t][2] << " "<< coeffs[t][3] << std::endl;
  }
  coeffs[n - 1][0] = 0;
  coeffs[n - 1][1] = 0;
  coeffs[n - 1][2] = 0;
  coeffs[n - 1][3] = 0;

  coeffs[n][0] = 0;
  coeffs[n][1] = 0;
  coeffs[n][2] = 0;
  coeffs[n][3] = 0;

  delete [] gtT;
  gtT = NULL;
}